

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

bool __thiscall
llama_context::state_load_file
          (llama_context *this,char *filepath,llama_token *tokens_out,size_t n_token_capacity,
          size_t *n_token_count_out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t sVar4;
  llama_io_read_file *plVar5;
  llama_io_read_file *this_00;
  ulong in_RCX;
  ulong *in_R8;
  bool bVar6;
  size_t n_read;
  llama_io_read_file io;
  size_t n_state_size_cur;
  uint32_t n_token_count;
  uint32_t version;
  llama_context *in_stack_00000090;
  uint32_t magic;
  llama_file file;
  llama_file *in_stack_ffffffffffffff28;
  llama_io_read_file *in_stack_ffffffffffffff30;
  byte local_1;
  
  llama_file::llama_file
            ((llama_file *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
             (char *)0x3e024d);
  uVar1 = llama_file::read_u32((llama_file *)0x3e0257);
  uVar2 = llama_file::read_u32((llama_file *)0x3e0275);
  if ((uVar1 == 0x6767736e) && (uVar2 == 9)) {
    uVar1 = llama_file::read_u32((llama_file *)0x3e0306);
    if (in_RCX < uVar1) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: token count in session file exceeded capacity! %u > %zu\n",
                         "state_load_file",(ulong)uVar1,in_RCX);
      local_1 = 0;
    }
    else {
      llama_file::read_raw
                ((llama_file *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0x3e038d);
      *in_R8 = (ulong)uVar1;
      sVar3 = llama_file::size((llama_file *)0x3e03b0);
      sVar4 = llama_file::tell((llama_file *)0x3e03c4);
      plVar5 = (llama_io_read_file *)(sVar3 - sVar4);
      llama_io_read_file::llama_io_read_file(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      this_00 = (llama_io_read_file *)state_read_data(in_stack_00000090,_version);
      bVar6 = this_00 == plVar5;
      if (!bVar6) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,
                           "%s: did not read all of the session file data! size %zu, got %zu\n",
                           "state_load_file",plVar5,this_00);
        local_1 = 0;
      }
      llama_io_read_file::~llama_io_read_file(this_00);
      if (bVar6) {
        local_1 = 1;
      }
    }
  }
  else {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: unknown (magic, version) for session file: %08x, %08x\n",
                       "state_load_file",(ulong)uVar1,(ulong)uVar2);
    local_1 = 0;
  }
  llama_file::~llama_file((llama_file *)0x3e04ba);
  return (bool)(local_1 & 1);
}

Assistant:

bool llama_context::state_load_file(const char * filepath, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    llama_file file(filepath, "rb");

    // sanity checks
    {
        const uint32_t magic   = file.read_u32();
        const uint32_t version = file.read_u32();

        if (magic != LLAMA_SESSION_MAGIC || version != LLAMA_SESSION_VERSION) {
            LLAMA_LOG_ERROR("%s: unknown (magic, version) for session file: %08x, %08x\n", __func__, magic, version);
            return false;
        }
    }

    // load the prompt
    {
        const uint32_t n_token_count = file.read_u32();

        if (n_token_count > n_token_capacity) {
            LLAMA_LOG_ERROR("%s: token count in session file exceeded capacity! %u > %zu\n", __func__, n_token_count, n_token_capacity);
            return false;
        }

        file.read_raw(tokens_out, sizeof(llama_token) * n_token_count);
        *n_token_count_out = n_token_count;
    }

    // restore the context state
    {
        const size_t n_state_size_cur = file.size() - file.tell();

        llama_io_read_file io( &file);
        const size_t n_read = state_read_data(io);

        if (n_read != n_state_size_cur) {
            LLAMA_LOG_ERROR("%s: did not read all of the session file data! size %zu, got %zu\n", __func__, n_state_size_cur, n_read);
            return false;
        }
    }

    return true;
}